

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::visitStore(InstrumentMemory *this,Store *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_01;
  BasicType BVar1;
  Module *pMVar2;
  Memory *pMVar3;
  Call *pCVar4;
  PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_> *this_00;
  allocator<wasm::Expression_*> local_131;
  Const *local_130;
  pointer local_128;
  Const **local_120;
  size_type local_118;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_110;
  size_t local_f8;
  char *pcStack_f0;
  undefined1 auStack_e0 [8];
  Name target;
  allocator<wasm::Expression_*> local_b1;
  Const *local_b0;
  Const *local_a8;
  Const *local_a0;
  pointer local_98;
  Const **local_90;
  size_type local_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  size_t local_68;
  char *pcStack_60;
  uintptr_t local_50;
  Const *local_48;
  Const *offset;
  Type indexType;
  Memory *mem;
  Builder builder;
  Store *curr_local;
  InstrumentMemory *this_local;
  
  this->id = this->id + 1;
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
             ).
             super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>;
  builder.wasm = (Module *)curr;
  pMVar2 = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     );
  Builder::Builder((Builder *)&mem,pMVar2);
  pMVar2 = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     );
  indexType.id = (uintptr_t)
                 ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = Module::getMemory(pMVar2,(IString)*(IString *)
                                              &((builder.wasm)->tags).
                                               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                               ._M_impl.super__Vector_impl_data);
  local_50 = (pMVar3->indexType).id;
  offset = (Const *)local_50;
  local_48 = Builder::makeConstPtr
                       ((Builder *)&mem,
                        (uint64_t)
                        ((builder.wasm)->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(Type)local_50);
  local_68 = store_ptr;
  pcStack_60 = DAT_027e5310;
  local_b0 = Builder::makeConst<int>((Builder *)&mem,this->id);
  local_a8 = Builder::makeConst<int>
                       ((Builder *)&mem,
                        (uint)*(byte *)&((builder.wasm)->exports).
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_a0 = local_48;
  local_98 = ((builder.wasm)->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = &local_b0;
  local_88 = 4;
  std::allocator<wasm::Expression_*>::allocator(&local_b1);
  __l_00._M_len = local_88;
  __l_00._M_array = (iterator)local_90;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_80,__l_00,&local_b1);
  target.super_IString.str._M_str = (char *)offset;
  target_01.super_IString.str._M_str = pcStack_60;
  target_01.super_IString.str._M_len = local_68;
  pCVar4 = Builder::makeCall((Builder *)&mem,target_01,&local_80,(Type)offset,false);
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar4;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_80);
  std::allocator<wasm::Expression_*>::~allocator(&local_b1);
  wasm::Name::Name((Name *)auStack_e0);
  BVar1 = wasm::Type::getBasic
                    ((Type *)(((builder.wasm)->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1));
  switch(BVar1) {
  case i32:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&store_val_i32);
    break;
  case i64:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&store_val_i64);
    break;
  case f32:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&store_val_f32);
    break;
  case f64:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&store_val_f64);
    break;
  default:
    goto switchD_017a86a2_default;
  }
  local_f8 = (size_t)auStack_e0;
  pcStack_f0 = (char *)target.super_IString.str._M_len;
  local_130 = Builder::makeConst<int>((Builder *)&mem,this->id);
  local_128 = ((builder.wasm)->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_120 = &local_130;
  local_118 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_131);
  __l._M_len = local_118;
  __l._M_array = (iterator)local_120;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_110,__l,&local_131);
  target_00.super_IString.str._M_str = pcStack_f0;
  target_00.super_IString.str._M_len = local_f8;
  pCVar4 = Builder::makeCall((Builder *)&mem,target_00,&local_110,
                             (Type)((builder.wasm)->globals).
                                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[1]._M_t.
                                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                   .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,false)
  ;
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar4;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_110);
  std::allocator<wasm::Expression_*>::~allocator(&local_131);
switchD_017a86a2_default:
  return;
}

Assistant:

void visitStore(Store* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(store_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->value->type.getBasic()) {
      case Type::i32:
        target = store_val_i32;
        break;
      case Type::i64:
        target = store_val_i64;
        break;
      case Type::f32:
        target = store_val_f32;
        break;
      case Type::f64:
        target = store_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    curr->value = builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr->value}, curr->value->type);
  }